

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int arkStep_ComputeSolutions(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  sunrealtype *psVar2;
  N_Vector *pp_Var3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  sunrealtype *psVar8;
  long lVar9;
  sunrealtype *psVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  sunrealtype sVar14;
  int local_44;
  N_Vector local_40;
  N_Vector local_38;
  
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeARKStepMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xb36,"arkStep_ComputeSolutions",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  local_38 = ark_mem->ycur;
  local_40 = ark_mem->tempv1;
  psVar2 = step_mem->cvals;
  pp_Var3 = step_mem->Xvecs;
  *dsmPtr = 0.0;
  if (step_mem->explicit == 0) {
    if (step_mem->implicit == 0) goto LAB_00121281;
    bVar13 = false;
LAB_001210fa:
    iVar5 = ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi);
    if (!(bool)(iVar5 == 0 | bVar13)) goto LAB_00121281;
  }
  else {
    iVar5 = ARKodeButcherTable_IsStifflyAccurate(step_mem->Be);
    bVar13 = iVar5 == 0;
    if (step_mem->implicit != 0) goto LAB_001210fa;
    if (iVar5 != 0) goto LAB_00121281;
  }
  *psVar2 = 1.0;
  *pp_Var3 = ark_mem->yn;
  iVar5 = step_mem->stages;
  lVar7 = (long)iVar5;
  if (lVar7 < 1) {
    local_44 = 1;
  }
  else {
    iVar6 = step_mem->explicit;
    iVar1 = step_mem->implicit;
    local_44 = 1;
    lVar9 = 0;
    do {
      if (iVar6 != 0) {
        psVar2[local_44] = ark_mem->h * step_mem->Be->b[lVar9];
        pp_Var3[local_44] = step_mem->Fe[lVar9];
        local_44 = local_44 + 1;
      }
      if (iVar1 != 0) {
        psVar2[local_44] = ark_mem->h * step_mem->Bi->b[lVar9];
        pp_Var3[local_44] = step_mem->Fi[lVar9];
        local_44 = local_44 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  lVar9 = 0x68;
  if ((step_mem->expforcing != 0) || (lVar9 = 0x70, step_mem->impforcing != 0)) {
    if (iVar5 < 1) {
      psVar10 = step_mem->stage_times;
      psVar8 = step_mem->stage_coefs;
    }
    else {
      lVar9 = *(long *)((long)&step_mem->fe + lVar9);
      lVar4 = *(long *)(lVar9 + 0x18);
      lVar9 = *(long *)(lVar9 + 0x20);
      psVar10 = step_mem->stage_times;
      psVar8 = step_mem->stage_coefs;
      lVar11 = 0;
      do {
        psVar10[lVar11] = *(double *)(lVar4 + lVar11 * 8) * ark_mem->h + ark_mem->tn;
        psVar8[lVar11] = ark_mem->h * *(double *)(lVar9 + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (lVar7 != lVar11);
    }
    arkStep_ApplyForcing(step_mem,psVar10,psVar8,iVar5,&local_44);
  }
  iVar5 = N_VLinearCombination(local_44,psVar2,pp_Var3,local_38);
  if (iVar5 != 0) {
    return -0x1c;
  }
LAB_00121281:
  iVar5 = 0;
  if (ark_mem->fixedstep == 0) {
    iVar5 = step_mem->stages;
    lVar7 = (long)iVar5;
    if (lVar7 < 1) {
      local_44 = 0;
    }
    else {
      iVar6 = step_mem->explicit;
      iVar1 = step_mem->implicit;
      lVar9 = 0;
      local_44 = 0;
      do {
        if (iVar6 != 0) {
          psVar2[local_44] = (step_mem->Be->b[lVar9] - step_mem->Be->d[lVar9]) * ark_mem->h;
          pp_Var3[local_44] = step_mem->Fe[lVar9];
          local_44 = local_44 + 1;
        }
        if (iVar1 != 0) {
          psVar2[local_44] = (step_mem->Bi->b[lVar9] - step_mem->Bi->d[lVar9]) * ark_mem->h;
          pp_Var3[local_44] = step_mem->Fi[lVar9];
          local_44 = local_44 + 1;
        }
        lVar9 = lVar9 + 1;
      } while (lVar7 != lVar9);
    }
    lVar9 = 0x68;
    if ((step_mem->expforcing != 0) || (lVar9 = 0x70, step_mem->impforcing != 0)) {
      if (iVar5 < 1) {
        psVar10 = step_mem->stage_times;
        psVar8 = step_mem->stage_coefs;
      }
      else {
        lVar9 = *(long *)((long)&step_mem->fe + lVar9);
        lVar4 = *(long *)(lVar9 + 0x28);
        lVar11 = *(long *)(lVar9 + 0x18);
        lVar9 = *(long *)(lVar9 + 0x20);
        psVar10 = step_mem->stage_times;
        psVar8 = step_mem->stage_coefs;
        lVar12 = 0;
        do {
          psVar10[lVar12] = *(double *)(lVar11 + lVar12 * 8) * ark_mem->h + ark_mem->tn;
          psVar8[lVar12] =
               (*(double *)(lVar9 + lVar12 * 8) - *(double *)(lVar4 + lVar12 * 8)) * ark_mem->h;
          lVar12 = lVar12 + 1;
        } while (lVar7 != lVar12);
      }
      arkStep_ApplyForcing(step_mem,psVar10,psVar8,iVar5,&local_44);
    }
    iVar6 = N_VLinearCombination(local_44,psVar2,pp_Var3,local_40);
    iVar5 = -0x1c;
    if (iVar6 == 0) {
      sVar14 = (sunrealtype)N_VWrmsNorm(local_40,ark_mem->ewt);
      *dsmPtr = sVar14;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int arkStep_ComputeSolutions(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunrealtype* cj;
  sunrealtype* bj;
  sunrealtype* dj;
  sunbooleantype stiffly_accurate;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts, and shortcut to time at end of step */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* check if the method is stiffly accurate */
  stiffly_accurate = SUNTRUE;

  if (step_mem->explicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  if (step_mem->implicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  /* If the method is stiffly accurate, ycur is already the new solution */

  if (!stiffly_accurate)
  {
    /* Compute time step solution (if necessary) */
    /*   set arrays for fused vector operation */
    cvals[0] = ONE;
    Xvecs[0] = ark_mem->yn;
    nvec     = 1;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Be->b[j];
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Bi->b[j];
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      if (step_mem->expforcing)
      {
        cj = step_mem->Be->c;
        bj = step_mem->Be->b;
      }
      else
      {
        cj = step_mem->Bi->c;
        bj = step_mem->Bi->b;
      }

      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h * bj[j];
      }

      arkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /*   call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
  }

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    /* set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Be->b[j] - step_mem->Be->d[j]);
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Bi->b[j] - step_mem->Bi->d[j]);
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      if (step_mem->expforcing)
      {
        cj = step_mem->Be->c;
        bj = step_mem->Be->b;
        dj = step_mem->Be->d;
      }
      else
      {
        cj = step_mem->Bi->c;
        bj = step_mem->Bi->b;
        dj = step_mem->Bi->d;
      }

      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h * (bj[j] - dj[j]);
      }

      arkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}